

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::EpsCopyInputStream::PopLimit(EpsCopyInputStream *this,int delta)

{
  char *pcVar1;
  bool bVar2;
  int *piVar3;
  int in_ESI;
  EpsCopyInputStream *in_RDI;
  int local_18;
  int local_14;
  
  local_14 = in_ESI;
  bVar2 = EndedAtLimit(in_RDI);
  bVar2 = ((bVar2 ^ 0xffU) & 1) == 0;
  if (bVar2) {
    in_RDI->limit_ = in_RDI->limit_ + local_14;
    pcVar1 = in_RDI->buffer_end_;
    local_18 = 0;
    piVar3 = std::min<int>(&local_18,&in_RDI->limit_);
    in_RDI->limit_end_ = pcVar1 + *piVar3;
  }
  return bVar2;
}

Assistant:

PROTOBUF_MUST_USE_RESULT bool PopLimit(int delta) {
    if (PROTOBUF_PREDICT_FALSE(!EndedAtLimit())) return false;
    limit_ = limit_ + delta;
    // TODO(gerbens) We could remove this line and hoist the code to
    // DoneFallback. Study the perf/bin-size effects.
    limit_end_ = buffer_end_ + (std::min)(0, limit_);
    return true;
  }